

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::DataSourceDescriptor> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::DataSourceDescriptor>::operator=
          (CopyablePtr<perfetto::protos::gen::DataSourceDescriptor> *this,
          CopyablePtr<perfetto::protos::gen::DataSourceDescriptor> *other)

{
  DataSourceDescriptor *this_00;
  CopyablePtr<perfetto::protos::gen::DataSourceDescriptor> *other_local;
  CopyablePtr<perfetto::protos::gen::DataSourceDescriptor> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
  ::operator=(&this->ptr_,&other->ptr_);
  this_00 = (DataSourceDescriptor *)operator_new(0xc0);
  perfetto::protos::gen::DataSourceDescriptor::DataSourceDescriptor(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
  ::reset(&other->ptr_,this_00);
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }